

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.c
# Opt level: O2

void blake2b_long(void *out,size_t outlen,void *in,size_t inlen)

{
  void *__dest;
  int iVar1;
  ulong outlen_00;
  int local_14c;
  uint8_t out_buffer [64];
  blake2b_state blake_state;
  
  iVar1 = (int)outlen;
  local_14c = iVar1;
  if (outlen < 0x41) {
    blake_state.h[1] = 0xbb67ae8584caa73b;
    blake_state.h[6] = 0x1f83d9abfb41bd6b;
    blake_state.h[7] = 0x5be0cd19137e2179;
    blake_state.h[4] = 0x510e527fade682d1;
    blake_state.h[5] = 0x9b05688c2b3e6c1f;
    blake_state.h[2] = 0x3c6ef372fe94f82b;
    blake_state.h[3] = 0xa54ff53a5f1d36f1;
    blake_state.buflen = 0;
    blake_state.t[0] = 0;
    blake_state.t[1] = 0;
    blake_state.h[0] = outlen ^ 0x6a09e667f2bdc908;
    blake2b_update(&blake_state,&local_14c,4);
    blake2b_update(&blake_state,in,inlen);
    blake2b_final(&blake_state,out,outlen);
  }
  else {
    blake_state.h[1] = 0xbb67ae8584caa73b;
    blake_state.h[2] = 0x3c6ef372fe94f82b;
    blake_state.h[3] = 0xa54ff53a5f1d36f1;
    blake_state.h[4] = 0x510e527fade682d1;
    blake_state.h[5] = 0x9b05688c2b3e6c1f;
    blake_state.h[6] = 0x1f83d9abfb41bd6b;
    blake_state.h[7] = 0x5be0cd19137e2179;
    blake_state.buflen = 0;
    blake_state.t[0] = 0;
    blake_state.t[1] = 0;
    blake_state.h[0] = 0x6a09e667f2bdc948;
    blake2b_update(&blake_state,&local_14c,4);
    blake2b_update(&blake_state,in,inlen);
    __dest = (void *)((long)out + 0x20);
    outlen_00 = (ulong)(iVar1 - 0x20);
    while( true ) {
      blake2b_final(&blake_state,out_buffer,0x40);
      *(undefined8 *)((long)__dest + -0x10) = out_buffer._16_8_;
      *(undefined8 *)((long)__dest + -8) = out_buffer._24_8_;
      *(undefined8 *)((long)__dest + -0x20) = out_buffer._0_8_;
      *(undefined8 *)((long)__dest + -0x18) = out_buffer._8_8_;
      if ((uint)outlen_00 < 0x41) break;
      blake_state.h[6] = 0x1f83d9abfb41bd6b;
      blake_state.h[7] = 0x5be0cd19137e2179;
      blake_state.h[4] = 0x510e527fade682d1;
      blake_state.h[5] = 0x9b05688c2b3e6c1f;
      blake_state.h[2] = 0x3c6ef372fe94f82b;
      blake_state.h[3] = 0xa54ff53a5f1d36f1;
      blake_state.h[1] = 0xbb67ae8584caa73b;
      blake_state.buflen = 0;
      blake_state.t[0] = 0;
      blake_state.t[1] = 0;
      blake_state.h[0] = 0x6a09e667f2bdc948;
      blake2b_update(&blake_state,out_buffer,0x40);
      __dest = (void *)((long)__dest + 0x20);
      outlen_00 = outlen_00 - 0x20;
    }
    blake_state.h[6] = 0x1f83d9abfb41bd6b;
    blake_state.h[7] = 0x5be0cd19137e2179;
    blake_state.h[4] = 0x510e527fade682d1;
    blake_state.h[5] = 0x9b05688c2b3e6c1f;
    blake_state.h[2] = 0x3c6ef372fe94f82b;
    blake_state.h[3] = 0xa54ff53a5f1d36f1;
    blake_state.h[1] = 0xbb67ae8584caa73b;
    blake_state.buflen = 0;
    blake_state.t[0] = 0;
    blake_state.t[1] = 0;
    blake_state.h[0] = outlen_00 ^ 0x6a09e667f2bdc908;
    blake2b_update(&blake_state,out_buffer,0x40);
    blake2b_final(&blake_state,out_buffer,outlen_00);
    memcpy(__dest,out_buffer,outlen_00);
    clear_internal_memory(out_buffer,0x40);
  }
  return;
}

Assistant:

void blake2b_long(void *out, size_t outlen, const void *in, size_t inlen)
{
    uint8_t *pout = (uint8_t *)out;
    blake2b_state blake_state;
    uint8_t outlen_bytes[sizeof(uint32_t)] = {0};

    store32(outlen_bytes, (uint32_t)outlen);
    if (outlen <= BLAKE2B_OUTBYTES) {
        blake2b_init(&blake_state, outlen);
        blake2b_update(&blake_state, outlen_bytes, sizeof(outlen_bytes));
        blake2b_update(&blake_state, in, inlen);
        blake2b_final(&blake_state, pout, outlen);
    } else {
        uint32_t toproduce;
        uint8_t out_buffer[BLAKE2B_OUTBYTES];

        blake2b_init(&blake_state, BLAKE2B_OUTBYTES);
        blake2b_update(&blake_state, outlen_bytes, sizeof(outlen_bytes));
        blake2b_update(&blake_state, in, inlen);
        blake2b_final(&blake_state, out_buffer, BLAKE2B_OUTBYTES);

        memcpy(pout, out_buffer, BLAKE2B_OUTBYTES / 2);
        pout += BLAKE2B_OUTBYTES / 2;
        toproduce = (uint32_t)outlen - BLAKE2B_OUTBYTES / 2;

        while (toproduce > BLAKE2B_OUTBYTES) {
            blake2b_init(&blake_state, BLAKE2B_OUTBYTES);
            blake2b_update(&blake_state, out_buffer, BLAKE2B_OUTBYTES);
            blake2b_final(&blake_state, out_buffer, BLAKE2B_OUTBYTES);

            memcpy(pout, out_buffer, BLAKE2B_OUTBYTES / 2);
            pout += BLAKE2B_OUTBYTES / 2;
            toproduce -= BLAKE2B_OUTBYTES / 2;
        }

        blake2b_init(&blake_state, toproduce);
        blake2b_update(&blake_state, out_buffer, BLAKE2B_OUTBYTES);
        blake2b_final(&blake_state, out_buffer, toproduce);

        memcpy(pout, out_buffer, toproduce);

        clear_internal_memory(out_buffer, sizeof(out_buffer));
    }
}